

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.cpp
# Opt level: O0

MPP_RET mpi_encode_get_packet(MppCtx ctx,MppPacket *packet)

{
  MpiImpl *p;
  MPP_RET ret;
  MppPacket *packet_local;
  MppCtx ctx_local;
  
  if ((mpi_debug & 1) != 0) {
    _mpp_log_l(4,"mpi","enter ctx %p packet %p\n","mpi_encode_get_packet",ctx,packet);
  }
  p._4_4_ = _check_mpp_ctx((MpiImpl *)ctx,"mpi_encode_get_packet");
  if (p._4_4_ == MPP_OK) {
    if (packet == (MppPacket *)0x0) {
      _mpp_log_l(2,"mpi","found NULL input packet\n","mpi_encode_get_packet");
      p._4_4_ = MPP_ERR_NULL_PTR;
    }
    else {
      p._4_4_ = Mpp::get_packet(*(Mpp **)((long)ctx + 0x18),packet);
    }
  }
  if ((mpi_debug & 1) != 0) {
    _mpp_log_l(4,"mpi","leave ctx %p ret %d\n","mpi_encode_get_packet",ctx,(ulong)(uint)p._4_4_);
  }
  return p._4_4_;
}

Assistant:

static MPP_RET mpi_encode_get_packet(MppCtx ctx, MppPacket *packet)
{
    MPP_RET ret = MPP_NOK;
    MpiImpl *p = (MpiImpl *)ctx;

    mpi_dbg_func("enter ctx %p packet %p\n", ctx, packet);
    do {
        ret = check_mpp_ctx(p);
        if (ret)
            break;

        if (NULL == packet) {
            mpp_err_f("found NULL input packet\n");
            ret = MPP_ERR_NULL_PTR;
            break;
        }

        ret = p->ctx->get_packet(packet);
    } while (0);

    mpi_dbg_func("leave ctx %p ret %d\n", ctx, ret);
    return ret;
}